

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

char * anon_unknown.dwarf_11bb3::ReadAttribute
                 (string *name,string *ty,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *data,char *ptr)

{
  char *ptr_00;
  int *piVar1;
  reference __dest;
  size_type __new_size;
  
  if (*ptr != '\0') {
    ptr_00 = ReadString(name,ptr);
    piVar1 = (int *)ReadString(ty,ptr_00);
    __new_size = (size_type)*piVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(data,__new_size);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
    memcpy(__dest,piVar1 + 1,__new_size);
    return (char *)((long)piVar1 + __new_size + 4);
  }
  return (char *)0x0;
}

Assistant:

const char *ReadAttribute(std::string &name, std::string &ty,
                          std::vector<unsigned char> &data, const char *ptr) {

  if ((*ptr) == 0) {
    // end of attribute.
    return NULL;
  }

  const char *p = ReadString(name, ptr);

  p = ReadString(ty, p);

  int dataLen;
  memcpy(&dataLen, p, sizeof(int));
  p += 4;

  if (IsBigEndian()) {
    swap4(reinterpret_cast<unsigned int *>(&dataLen));
  }

  data.resize(dataLen);
  memcpy(&data.at(0), p, dataLen);
  p += dataLen;

  return p;
}